

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.h
# Opt level: O0

pair<eastl::pair<char,_int>_*,_eastl::pair<char,_int>_*>
eastl::
equal_range<eastl::pair<char,int>*,char,eastl::detail::compare_impl<eastl::pair<char,int>,eastl::less<char>>>
          (pair<char,_int> *first,pair<char,_int> *last,DifferenceType value)

{
  bool bVar1;
  pair<char,_int> *local_70;
  undefined1 local_61;
  pair<char,_int> *local_60;
  long local_58;
  pair<char,_int> *j;
  DifferenceType d2;
  pair<char,_int> *i;
  DifferenceType d;
  char *value_local;
  pair<char,_int> *last_local;
  pair<char,_int> *first_local;
  pair<eastl::pair<char,_int>_*,_eastl::pair<char,_int>_*> local_18;
  
  d = value;
  value_local = &last->first;
  last_local = first;
  i = (pair<char,_int> *)distance<eastl::pair<char,int>*>(first,last);
  while( true ) {
    while( true ) {
      if ((long)i < 1) {
        pair<eastl::pair<char,_int>_*,_eastl::pair<char,_int>_*>::pair
                  (&local_18,&last_local,&last_local);
        return local_18;
      }
      d2 = (DifferenceType)last_local;
      j = (pair<char,_int> *)((long)i >> 1);
      advance<eastl::pair<char,int>*,long>((pair<char,_int> **)&d2,(long)j);
      bVar1 = detail::compare_impl<eastl::pair<char,_int>,_eastl::less<char>_>::operator()
                        ((compare_impl<eastl::pair<char,_int>,_eastl::less<char>_> *)
                         ((long)&first_local + 7),(pair_type *)d2,(first_argument_type *)d);
      if (!bVar1) break;
      d2 = d2 + 8;
      i = (pair<char,_int> *)((long)i - (long)&j->field_0x1);
      last_local = (pair<char,_int> *)d2;
    }
    bVar1 = detail::compare_impl<eastl::pair<char,_int>,_eastl::less<char>_>::operator()
                      ((compare_impl<eastl::pair<char,_int>,_eastl::less<char>_> *)
                       ((long)&first_local + 7),(first_argument_type *)d,(pair_type *)d2);
    if (!bVar1) break;
    i = j;
    value_local = (char *)d2;
  }
  local_58 = d2;
  local_61 = first_local._7_1_;
  local_60 = lower_bound<eastl::pair<char,int>*,char,eastl::detail::compare_impl<eastl::pair<char,int>,eastl::less<char>>>
                       (last_local,d2,d);
  local_58 = local_58 + 8;
  local_70 = upper_bound<eastl::pair<char,int>*,char,eastl::detail::compare_impl<eastl::pair<char,int>,eastl::less<char>>>
                       (local_58,value_local,d);
  pair<eastl::pair<char,_int>_*,_eastl::pair<char,_int>_*>::pair(&local_18,&local_60,&local_70);
  return local_18;
}

Assistant:

pair<ForwardIterator, ForwardIterator>
    equal_range(ForwardIterator first, ForwardIterator last, const T& value, Compare compare)
    {
        typedef pair<ForwardIterator, ForwardIterator> ResultType;
        typedef typename eastl::iterator_traits<ForwardIterator>::difference_type DifferenceType;

        DifferenceType d = eastl::distance(first, last);

        while(d > 0)
        {
            ForwardIterator i(first);
            DifferenceType  d2 = d >> 1; // We use '>>1' here instead of '/2' because MSVC++ for some reason generates significantly worse code for '/2'. Go figure.

            eastl::advance(i, d2);

            if(compare(*i, value))
            {
                EASTL_VALIDATE_COMPARE(!compare(value, *i)); // Validate that the compare function is sane.
                first = ++i;
                d    -= d2 + 1;
            }
            else if(compare(value, *i))
            {
                EASTL_VALIDATE_COMPARE(!compare(*i, value)); // Validate that the compare function is sane.
                d    = d2;
                last = i;
            }
            else
            {
                ForwardIterator j(i);

                return ResultType(eastl::lower_bound(first, i, value, compare), 
                                  eastl::upper_bound(++j, last, value, compare));
            }
        }
        return ResultType(first, first);
    }